

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O2

void write_row_callback(png_structp png_ptr,png_uint_32 row_number,int pass)

{
  if (png_ptr == (png_structp)0x0) {
    png_error(0,"write_row_callback: bad png_ptr");
  }
  if (-1 < (int)row_number) {
    if ((uint)pass < 8) {
      fputc(0x77,_stdout);
      return;
    }
    png_error(png_ptr,"write_row_callback: bad pass");
  }
  png_error(png_ptr,"write_row_callback: bad row number");
}

Assistant:

static void PNGCBAPI
write_row_callback(png_structp png_ptr, png_uint_32 row_number, int pass)
{
   /* The callback should always receive correct parameters. */
   if (png_ptr == NULL)
      png_error(png_ptr, "write_row_callback: bad png_ptr");
   if (row_number > PNG_UINT_31_MAX)
      png_error(png_ptr, "write_row_callback: bad row number");
   if (pass < 0 || pass > 7)
      png_error(png_ptr, "write_row_callback: bad pass");

   fprintf(stdout, "w");
}